

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O2

HeaderField * __thiscall HPack::FieldLookupTable::back(FieldLookupTable *this)

{
  const_reference this_00;
  type this_01;
  reference pvVar1;
  uint uVar2;
  
  uVar2 = this->end - 1;
  this_00 = std::
            deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
            ::operator[](&this->chunks,(ulong)(uVar2 >> 4));
  this_01 = std::
            unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
            ::operator*(this_00);
  pvVar1 = std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::operator[]
                     (this_01,(ulong)(uVar2 & 0xf));
  return pvVar1;
}

Assistant:

const HeaderField &FieldLookupTable::back() const
{
    Q_ASSERT(nDynamic && end && end != begin);

    const quint32 absIndex = end - 1;
    const quint32 chunkIndex = absIndex / ChunkSize;
    Q_ASSERT(chunkIndex < chunks.size());
    const quint32 offset = absIndex % ChunkSize;
    return (*chunks[chunkIndex])[offset];
}